

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ordering.hpp
# Opt level: O0

Result __thiscall
Kernel::LiteralOrdering<Kernel::LAKBO>::compare
          (LiteralOrdering<Kernel::LAKBO> *this,Literal *l1,Literal *l2)

{
  bool bVar1;
  Literal *in_stack_00000060;
  LiteralOrdering<Kernel::LAKBO> *in_stack_00000068;
  Option<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
  atoms2;
  Option<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
  atoms1;
  undefined1 in_stack_000000f0 [24];
  undefined1 in_stack_00000108 [24];
  Literal *in_stack_00000128;
  Literal *in_stack_00000130;
  LiteralOrdering<Kernel::LAKBO> *in_stack_00000138;
  OptionBase<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
  local_70;
  OptionBase<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
  local_48;
  Result local_4;
  
  atoms(in_stack_00000068,in_stack_00000060);
  atoms(in_stack_00000068,in_stack_00000060);
  bVar1 = Lib::
          OptionBase<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
          ::isSome(&local_48);
  if ((bVar1) ||
     (bVar1 = Lib::
              OptionBase<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
              ::isSome(&local_70), !bVar1)) {
    bVar1 = Lib::
            OptionBase<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
            ::isSome(&local_48);
    if ((!bVar1) ||
       (bVar1 = Lib::
                OptionBase<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
                ::isSome(&local_70), bVar1)) {
      bVar1 = Lib::
              OptionBase<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
              ::isSome(&local_48);
      if ((bVar1) &&
         (bVar1 = Lib::
                  OptionBase<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
                  ::isSome(&local_70), bVar1)) {
        local_4 = AlascaOrderingUtils::
                  lexLazy<Kernel::LiteralOrdering<Kernel::LAKBO>::compare(Kernel::Literal*,Kernel::Literal*)const::_lambda()_1_,Kernel::LiteralOrdering<Kernel::LAKBO>::compare(Kernel::Literal*,Kernel::Literal*)const::_lambda()_2_>
                            ((_ElementType)in_stack_000000f0,(_ElementType)in_stack_00000108);
      }
      else {
        local_4 = compareUninterpreted(in_stack_00000138,in_stack_00000130,in_stack_00000128);
      }
    }
    else {
      local_4 = LESS;
    }
  }
  else {
    local_4 = GREATER;
  }
  Lib::
  Option<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
  ::~Option((Option<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
             *)0x8c3543);
  Lib::
  Option<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
  ::~Option((Option<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
             *)0x8c3550);
  return local_4;
}

Assistant:

Result compare(Literal* l1, Literal* l2) const override {
    auto atoms1 = atoms(l1);
    auto atoms2 = atoms(l2);
    if (!atoms1.isSome() && atoms2.isSome()) {
      return Ordering::GREATER;

    } else if (atoms1.isSome() && !atoms2.isSome()) {
      return Ordering::LESS;

    } else if (atoms1.isSome() && atoms2.isSome()) {
      return AlascaOrderingUtils::lexLazy(
            [&](){ return OrderingUtils::mulExt(*atoms1, *atoms2, [&](auto l, auto r) { return cmpAtom(l, r); }); },
            [&](){ return cmpPrec(l1, l2); }
            );

    } else {
      ASS(atoms1.isNone() && atoms2.isNone())
      return compareUninterpreted(l1,l2);
    }
  }